

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QToolBarItem_*>::data(QList<QToolBarItem_*> *this)

{
  QArrayDataPointer<QToolBarItem_*> *this_00;
  QToolBarItem **ppQVar1;
  QArrayDataPointer<QToolBarItem_*> *in_RDI;
  
  detach((QList<QToolBarItem_*> *)0x7011bc);
  this_00 = (QArrayDataPointer<QToolBarItem_*> *)
            QArrayDataPointer<QToolBarItem_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QToolBarItem_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }